

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

int utf8_char_whitespace(utf8_char_t *c)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = 1;
  if (c != (utf8_char_t *)0x0) {
    bVar1 = *c;
    if (((0x20 < bVar1) && (bVar1 != 0x7f)) && ((bVar1 != 0xc2 || (c[1] != -0x60)))) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int utf8_char_whitespace(const utf8_char_t* c)
{
    // 0x7F is DEL
    if (!c || (c[0] >= 0 && c[0] <= ' ') || c[0] == 0x7F) {
        return 1;
    }

    // EIA608_CHAR_NO_BREAK_SPACE TODO other utf8 spaces
    if (0xC2 == (unsigned char)c[0] && 0xA0 == (unsigned char)c[1]) {
        return 1;
    }

    return 0;
}